

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
::merge_nodes(btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
              *this,node_type *left,node_type *right)

{
  bool bVar1;
  allocator_type *alloc;
  node_type *right_local;
  node_type *left_local;
  btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
  *this_local;
  
  alloc = mutable_allocator(this);
  btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
  ::merge(left,right,alloc);
  bVar1 = btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
          ::leaf(right);
  if (bVar1) {
    if (this->rightmost_ == right) {
      this->rightmost_ = left;
    }
    delete_leaf_node(this,right);
  }
  else {
    delete_internal_node(this,right);
  }
  return;
}

Assistant:

void btree<P>::merge_nodes(node_type *left, node_type *right) {
        left->merge(right, mutable_allocator());
        if (right->leaf()) {
            if (rightmost_ == right) rightmost_ = left;
            delete_leaf_node(right);
        } else {
            delete_internal_node(right);
        }
    }